

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O3

google_protobuf_OneofDescriptorProto * oneofdef_toproto(upb_ToProto_Context *ctx,upb_OneofDef *o)

{
  upb_Arena *puVar1;
  _Bool _Var2;
  upb_DecodeStatus uVar3;
  char *__s;
  size_t sVar4;
  google_protobuf_OneofOptions *msg;
  google_protobuf_OneofDescriptorProto *__s_00;
  anon_union_8_2_9eb4e620_for_upb_Message_0 msg_00;
  upb_StringView uVar5;
  size_t size;
  char *ptr;
  size_t local_40;
  char *local_38;
  
  puVar1 = ctx->arena;
  __s_00 = (google_protobuf_OneofDescriptorProto *)puVar1->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)__s_00) < 0x28) {
    __s_00 = (google_protobuf_OneofDescriptorProto *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x28);
  }
  else {
    if ((google_protobuf_OneofDescriptorProto *)
        ((ulong)((long)&(__s_00->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
        0xfffffffffffffff8) != __s_00) goto LAB_0011957c;
    puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(__s_00 + 5);
  }
  if (__s_00 != (google_protobuf_OneofDescriptorProto *)0x0) {
    memset(__s_00,0,0x28);
    __s = upb_OneofDef_Name(o);
    sVar4 = strlen(__s);
    uVar5.size = sVar4;
    uVar5.data = __s;
    uVar5 = strviewdup2(ctx,uVar5);
    if (((ulong)(__s_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) {
LAB_0011959b:
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/internal/accessors.h"
                    ,0x13b,
                    "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                   );
    }
    *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 1;
    *(upb_StringView *)(__s_00 + 2) = uVar5;
    _Var2 = upb_OneofDef_HasOptions(o);
    if (!_Var2) {
      return __s_00;
    }
    msg = upb_OneofDef_Options(o);
    upb_Encode(&msg->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__OneofOptions_msg_init,0,ctx->arena,&local_38,&local_40);
    if (local_38 != (char *)0x0) {
      puVar1 = ctx->arena;
      msg_00.internal_opaque = (uintptr_t)puVar1->ptr_dont_copy_me__upb_internal_use_only;
      if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x20) {
        msg_00 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
                 _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x20);
      }
      else {
        if ((char *)((ulong)(msg_00.internal_opaque + 7) & 0xfffffffffffffff8) !=
            (char *)msg_00.internal_opaque) {
LAB_0011957c:
          __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/internal/arena.h"
                        ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
        }
        puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00.internal_opaque + 0x20);
      }
      if ((anon_union_8_2_9eb4e620_for_upb_Message_0)msg_00.internal_opaque !=
          (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
        memset((void *)msg_00,0,0x20);
        uVar3 = upb_Decode(local_38,local_40,(upb_Message *)msg_00,
                           &google__protobuf__OneofOptions_msg_init,(upb_ExtensionRegistry *)0x0,0,
                           puVar1);
        if (uVar3 == kUpb_DecodeStatus_Ok) {
          if (((ulong)(__s_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
            *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
                 *(byte *)&__s_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 2;
            *(anon_union_8_2_9eb4e620_for_upb_Message_0 *)(__s_00 + 4) = msg_00;
            return __s_00;
          }
          goto LAB_0011959b;
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static google_protobuf_OneofDescriptorProto* oneofdef_toproto(upb_ToProto_Context* ctx,
                                                     const upb_OneofDef* o) {
  google_protobuf_OneofDescriptorProto* proto =
      google_protobuf_OneofDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_OneofDescriptorProto_set_name(proto,
                                       strviewdup(ctx, upb_OneofDef_Name(o)));

  if (upb_OneofDef_HasOptions(o)) {
    SET_OPTIONS(proto, OneofDescriptorProto, OneofOptions,
                upb_OneofDef_Options(o));
  }

  return proto;
}